

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::auto_cov(NaVector *this,NaVector *rVectACF)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  long *in_RSI;
  long *in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  NaReal fSum;
  NaReal fAvg;
  uint N;
  uint t;
  uint k;
  undefined8 local_30;
  undefined4 local_18;
  undefined4 local_14;
  
  uVar1 = (**(code **)(*in_RDI + 0x30))();
  (**(code **)(*in_RSI + 0x20))(in_RSI,uVar1);
  iVar2 = (**(code **)(*in_RDI + 0x30))();
  if (iVar2 != 0) {
    uVar3 = (**(code **)(*in_RDI + 0x30))();
    dVar5 = (double)(**(code **)(*in_RDI + 0x88))();
    for (local_14 = 0; local_14 < uVar3; local_14 = local_14 + 1) {
      local_30 = 0.0;
      for (local_18 = 0; local_18 < uVar3 + local_14; local_18 = local_18 + 1) {
        dVar6 = (double)(**(code **)(*in_RDI + 0x48))(in_RDI,(ulong)local_18 % (ulong)uVar3);
        dVar7 = (double)(**(code **)(*in_RDI + 0x48))
                                  (in_RDI,(ulong)(local_18 + local_14) % (ulong)uVar3);
        local_30 = (dVar6 - dVar5) * (dVar7 - dVar5) + local_30;
      }
      pdVar4 = (double *)(**(code **)(*in_RSI + 0x40))(in_RSI,local_14);
      *pdVar4 = local_30 / (double)uVar3;
    }
  }
  return;
}

Assistant:

void
NaVector::auto_cov (NaVector& rVectACF) const
{
    rVectACF.new_dim(dim());

    if(0 == dim())
        return;

    unsigned    k, t, N = dim();
    NaReal      fAvg = average();

    // Compute ACF
    for(k = 0; k < N; ++k){
        NaReal  fSum = 0;
        for(t = 0; t < N + k; ++t){
            fSum += (get(t % N) - fAvg) * (get((t + k) % N) - fAvg);
        }
        rVectACF[k] = fSum / N;
    }
}